

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

block * __thiscall
pstd::pmr::monotonic_buffer_resource::allocate_block(monotonic_buffer_resource *this,size_t size)

{
  block *pbVar1;
  size_t in_RSI;
  size_t in_RDI;
  block *b;
  size_t in_stack_ffffffffffffffd8;
  memory_resource *in_stack_ffffffffffffffe8;
  
  pbVar1 = (block *)memory_resource::allocate
                              (in_stack_ffffffffffffffe8,in_RDI,in_stack_ffffffffffffffd8);
  pbVar1->ptr = pbVar1 + 1;
  pbVar1->size = in_RSI;
  pbVar1->next = *(block **)(in_RDI + 0x28);
  *(block **)(in_RDI + 0x28) = pbVar1;
  return pbVar1;
}

Assistant:

block *allocate_block(size_t size) {
        // Single allocation for both the block and its memory. This means
        // that strictly speaking MemoryBlock::ptr is redundant, but let's not get too
        // fancy here...
        block *b = static_cast<block *>(
            upstream->allocate(sizeof(block) + size, alignof(block)));

        b->ptr = reinterpret_cast<char *>(b) + sizeof(block);
        b->size = size;
        b->next = block_list;
        block_list = b;

        return b;
    }